

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gus_pat.cpp
# Opt level: O2

int convert_8s(uchar *data,_sample *gus_sample)

{
  uint uVar1;
  short *psVar2;
  int *piVar3;
  char *pcVar4;
  int iVar5;
  ulong uVar6;
  
  uVar1 = gus_sample->data_length;
  psVar2 = (short *)calloc((ulong)(uVar1 + 2),2);
  gus_sample->data = psVar2;
  if (psVar2 == (short *)0x0) {
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    _WM_ERROR_NEW("(%s:%i) ERROR: calloc failed (%s)","convert_8s",0x49,pcVar4);
    iVar5 = -1;
  }
  else {
    iVar5 = 0;
    uVar6 = 0;
    do {
      psVar2[uVar6] = (ushort)data[uVar6] << 8;
      uVar6 = uVar6 + 1;
    } while (uVar1 != uVar6);
  }
  return iVar5;
}

Assistant:

static int convert_8s(unsigned char *data, struct _sample *gus_sample) {
	unsigned char *read_data = data;
	unsigned char *read_end = data + gus_sample->data_length;
	signed short int *write_data = NULL;

	SAMPLE_CONVERT_DEBUG(__FUNCTION__);
	gus_sample->data = (short*)calloc((gus_sample->data_length + 2),
			sizeof(signed short int));
	if (gus_sample->data != NULL) {
		write_data = gus_sample->data;
		do {
			*write_data++ = (*read_data++) << 8;
		} while (read_data != read_end);
		return 0;
	}

	_WM_ERROR_NEW("(%s:%i) ERROR: calloc failed (%s)", __FUNCTION__, __LINE__,
			strerror(errno));
	return -1;
}